

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Impulse_::scale_impulse(Blip_Impulse_ *this,int unit,imp_t *imp_in)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  imp_t *piVar5;
  imp_t *piVar6;
  imp_t *piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ushort *puVar11;
  int iVar12;
  bool bVar13;
  
  puVar11 = this->impulse;
  uVar2 = this->res;
  iVar9 = (int)uVar2 / 2 + 1;
  iVar3 = this->width;
  piVar5 = imp_in;
  while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, iVar4 = unit, iVar12 = iVar3, bVar13) {
    while (iVar12 != 0) {
      uVar1 = *puVar11;
      puVar11 = puVar11 + 1;
      uVar10 = ((ulong)uVar1 + 0x4000) * (ulong)(uint)unit + 0x4000 >> 0xf;
      *piVar5 = (imp_t)uVar10;
      piVar5 = piVar5 + 1;
      iVar4 = (iVar4 + unit) - (int)uVar10;
      iVar12 = iVar12 + -1;
    }
    piVar5[iVar3 / -2 + -1] = piVar5[iVar3 / -2 + -1] + (short)iVar4;
  }
  piVar7 = piVar5;
  if (2 < (int)uVar2) {
    piVar6 = piVar5;
    for (lVar8 = 0; piVar7 = piVar6 + 1, 1 - ((uVar2 >> 1) - 1) * iVar3 != (int)lVar8;
        lVar8 = lVar8 + -1) {
      *piVar6 = piVar5[(lVar8 + -2) - (long)iVar3];
      piVar6 = piVar7;
    }
    *piVar6 = (imp_t)unit;
  }
  *piVar7 = (imp_t)unit;
  memcpy(piVar7 + 1,imp_in,(long)(int)(iVar3 * uVar2) * 2 - 2);
  return;
}

Assistant:

void Blip_Impulse_::scale_impulse( int unit, imp_t* imp_in ) const
{
	long offset = ((long) unit << impulse_bits) - impulse_offset * unit +
			(1 << (impulse_bits - 1));
	imp_t* imp = imp_in;
	imp_t* fimp = impulse;
	for ( int n = res / 2 + 1; n--; )
	{
		int error = unit;
		for ( int nn = width; nn--; )
		{
			long a = ((long) *fimp++ * unit + offset) >> impulse_bits;
			error -= a - unit;
			*imp++ = (imp_t) a;
		}
		
		// add error to middle
		imp [-width / 2 - 1] += (imp_t) error;
	}
	
	if ( res > 2 ) {
		// second half is mirror-image
		const imp_t* rev = imp - width - 1;
		for ( int nn = (res / 2 - 1) * width - 1; nn--; )
			*imp++ = *--rev;
		*imp++ = (imp_t) unit;
	}
	
	// copy to odd offset
	*imp++ = (imp_t) unit;
	memcpy( imp, imp_in, (res * width - 1) * sizeof *imp );
}